

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void __thiscall absl::Mutex::LockSlowLoop(Mutex *this,SynchWaitParams *waitp,int flags)

{
  ulong uVar1;
  long *plVar2;
  MuHow pMVar3;
  long lVar4;
  Condition *pCVar5;
  uint uVar6;
  PerThreadSynch *pPVar7;
  ulong uVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar9;
  int extraout_EDX_01;
  ulong uVar10;
  synchronization_internal *this_00;
  bool bVar11;
  
  if (((this->mu_).super___atomic_base<long>._M_i & 0x10U) != 0) {
    PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 4);
  }
  if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
     (waitp->thread->suppress_fatal_errors == false)) {
    LockSlowLoop();
  }
  this_00 = (synchronization_internal *)0x0;
  do {
    uVar10 = (this->mu_).super___atomic_base<long>._M_i;
    CheckForMutexCorruption(uVar10,"Lock");
    pMVar3 = waitp->how;
    iVar9 = extraout_EDX;
    if ((pMVar3->slow_need_zero & uVar10) == 0) {
      LOCK();
      bVar11 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar11) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & uVar10 | pMVar3->fast_or) +
             pMVar3->fast_add;
      }
      UNLOCK();
      if (bVar11) {
LAB_00149aa3:
        pCVar5 = waitp->cond;
        if (((pCVar5 == (Condition *)0x0) || (pCVar5->eval_ == (_func_bool_Condition_ptr *)0x0)) ||
           (bVar11 = (*pCVar5->eval_)(pCVar5), bVar11)) {
          if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
             (waitp->thread->suppress_fatal_errors == false)) {
            LockSlowLoop();
          }
          if ((uVar10 & 0x10) != 0) {
            PostSynchEvent(this,(uint)(waitp->how != (MuHow)kExclusiveS) * 2 + 5);
            return;
          }
          return;
        }
        UnlockSlow(this,waitp);
LAB_00149ac5:
        Block(this,waitp->thread);
        flags = flags | 1;
        this_00 = (synchronization_internal *)0x0;
        iVar9 = extraout_EDX_00;
      }
    }
    else if ((uVar10 & 0x44) == 0) {
      pPVar7 = Enqueue((PerThreadSynch *)0x0,waitp,uVar10,flags);
      if (pPVar7 == (PerThreadSynch *)0x0) {
        LockSlowLoop();
      }
      uVar8 = (ulong)((uint)uVar10 & (uint)((flags & 1U) == 0) * 2 + 0xb9);
      uVar1 = uVar8 + 4;
      uVar8 = uVar8 | 0x24;
      if ((uVar10 & 1) == 0) {
        uVar8 = uVar1;
      }
      iVar9 = 0x16d1b0;
      if (waitp->how != (MuHow)kExclusiveS) {
        uVar8 = uVar1;
      }
      LOCK();
      bVar11 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar11) {
        (this->mu_).super___atomic_base<long>._M_i = uVar8 | (ulong)pPVar7;
      }
      UNLOCK();
      if (bVar11) goto LAB_00149ac5;
      waitp->thread->waitp = (SynchWaitParams *)0x0;
    }
    else if (((-(ulong)((flags & 1U) == 0) | 0xffffffffffffffdf) & pMVar3->slow_inc_need_zero &
             uVar10) == 0) {
      LOCK();
      bVar11 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar11) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffbc) & uVar10 | 0x41;
      }
      UNLOCK();
      if (bVar11) {
        plVar2 = (long *)((uVar10 & 0xffffffffffffff00) + 0x28);
        *plVar2 = *plVar2 + 0x100;
        do {
          uVar10 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar11 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar11) {
            (this->mu_).super___atomic_base<long>._M_i = (uVar10 & 0xffffffffffffffbe) + 1;
          }
          UNLOCK();
        } while (!bVar11);
        goto LAB_00149aa3;
      }
    }
    else if ((uVar10 & 0x40) == 0) {
      LOCK();
      bVar11 = uVar10 == (this->mu_).super___atomic_base<long>._M_i;
      if (bVar11) {
        (this->mu_).super___atomic_base<long>._M_i =
             ((ulong)((uint)((flags & 1U) == 0) * 2) | 0xffffffffffffffb9) & uVar10 | 0x44;
      }
      UNLOCK();
      if (bVar11) {
        pPVar7 = Enqueue((PerThreadSynch *)(uVar10 & 0xffffffffffffff00),waitp,uVar10,flags);
        if (pPVar7 == (PerThreadSynch *)0x0) {
          LockSlowLoop();
        }
        uVar10 = (ulong)(((uint)uVar10 & 1) << 5);
        if (waitp->how != (MuHow)kExclusiveS) {
          uVar10 = 0;
        }
        do {
          lVar4 = (this->mu_).super___atomic_base<long>._M_i;
          LOCK();
          bVar11 = lVar4 == (this->mu_).super___atomic_base<long>._M_i;
          if (bVar11) {
            (this->mu_).super___atomic_base<long>._M_i =
                 (ulong)((uint)lVar4 & 0xbb) | uVar10 | (ulong)pPVar7 | 4;
          }
          UNLOCK();
        } while (!bVar11);
        goto LAB_00149ac5;
      }
    }
    if ((waitp->thread->waitp != (SynchWaitParams *)0x0) &&
       (waitp->thread->suppress_fatal_errors == false)) {
      LockSlowLoop();
      iVar9 = extraout_EDX_01;
    }
    uVar6 = synchronization_internal::MutexDelay(this_00,1,iVar9);
    this_00 = (synchronization_internal *)(ulong)uVar6;
  } while( true );
}

Assistant:

void Mutex::LockSlowLoop(SynchWaitParams *waitp, int flags) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  intptr_t v = mu_.load(std::memory_order_relaxed);
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this,
         waitp->how == kExclusive?  SYNCH_EV_LOCK: SYNCH_EV_READERLOCK);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  for (;;) {
    v = mu_.load(std::memory_order_relaxed);
    CheckForMutexCorruption(v, "Lock");
    if ((v & waitp->how->slow_need_zero) == 0) {
      if (mu_.compare_exchange_strong(
              v,
              (waitp->how->fast_or |
               (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
                  waitp->how->fast_add,
              std::memory_order_acquire, std::memory_order_relaxed)) {
        if (waitp->cond == nullptr ||
            EvalConditionAnnotated(waitp->cond, this, true, false,
                                   waitp->how == kShared)) {
          break;  // we timed out, or condition true, so return
        }
        this->UnlockSlow(waitp);  // got lock but condition false
        this->Block(waitp->thread);
        flags |= kMuHasBlocked;
        c = 0;
      }
    } else {                      // need to access waiter list
      bool dowait = false;
      if ((v & (kMuSpin|kMuWait)) == 0) {   // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch *new_h = Enqueue(nullptr, waitp, v, flags);
        intptr_t nv =
            (v & ClearDesignatedWakerMask(flags & kMuHasBlocked) & kMuLow) |
            kMuWait;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to empty list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          nv |= kMuWrWait;
        }
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | nv,
                std::memory_order_release, std::memory_order_relaxed)) {
          dowait = true;
        } else {            // attempted Enqueue() failed
          // zero out the waitp field set by Enqueue()
          waitp->thread->waitp = nullptr;
        }
      } else if ((v & waitp->how->slow_inc_need_zero &
                  IgnoreWaitingWritersMask(flags & kMuHasBlocked)) == 0) {
        // This is a reader that needs to increment the reader count,
        // but the count is currently held in the last waiter.
        if (mu_.compare_exchange_strong(
                v,
                (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                    kMuSpin | kMuReader,
                std::memory_order_acquire, std::memory_order_relaxed)) {
          PerThreadSynch *h = GetPerThreadSynch(v);
          h->readers += kMuOne;       // inc reader count in waiter
          do {                        // release spinlock
            v = mu_.load(std::memory_order_relaxed);
          } while (!mu_.compare_exchange_weak(v, (v & ~kMuSpin) | kMuReader,
                                              std::memory_order_release,
                                              std::memory_order_relaxed));
          if (waitp->cond == nullptr ||
              EvalConditionAnnotated(waitp->cond, this, true, false,
                                     waitp->how == kShared)) {
            break;  // we timed out, or condition true, so return
          }
          this->UnlockSlow(waitp);           // got lock but condition false
          this->Block(waitp->thread);
          flags |= kMuHasBlocked;
          c = 0;
        }
      } else if ((v & kMuSpin) == 0 &&  // attempt to queue ourselves
                 mu_.compare_exchange_strong(
                     v,
                     (v & ClearDesignatedWakerMask(flags & kMuHasBlocked)) |
                         kMuSpin | kMuWait,
                     std::memory_order_acquire, std::memory_order_relaxed)) {
        PerThreadSynch *h = GetPerThreadSynch(v);
        PerThreadSynch *new_h = Enqueue(h, waitp, v, flags);
        intptr_t wr_wait = 0;
        ABSL_RAW_CHECK(new_h != nullptr, "Enqueue to list failed");
        if (waitp->how == kExclusive && (v & kMuReader) != 0) {
          wr_wait = kMuWrWait;      // give priority to a waiting writer
        }
        do {                        // release spinlock
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v, (v & (kMuLow & ~kMuSpin)) | kMuWait | wr_wait |
            reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        dowait = true;
      }
      if (dowait) {
        this->Block(waitp->thread);  // wait until removed from list or timeout
        flags |= kMuHasBlocked;
        c = 0;
      }
    }
    ABSL_RAW_CHECK(
        waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
        "detected illegal recursion into Mutex code");
    // delay, then try again
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
  ABSL_RAW_CHECK(
      waitp->thread->waitp == nullptr || waitp->thread->suppress_fatal_errors,
      "detected illegal recursion into Mutex code");
  if ((v & kMuEvent) != 0) {
    PostSynchEvent(this,
                   waitp->how == kExclusive? SYNCH_EV_LOCK_RETURNING :
                                      SYNCH_EV_READERLOCK_RETURNING);
  }
}